

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O1

QString * __thiscall
DelayImpEntryWrapper::getName(QString *__return_storage_ptr__,DelayImpEntryWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  storage_type *psVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  iVar1 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(this);
  if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    (__return_storage_ptr__->d).ptr = local_28;
  }
  else {
    psVar2 = (storage_type *)strlen((char *)CONCAT44(extraout_var,iVar1));
    QVar3.m_data = psVar2;
    QVar3.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar3);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    (__return_storage_ptr__->d).ptr = local_28;
  }
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString DelayImpEntryWrapper::getName()
{
    char* name = getLibraryName();
    if (!name) return "";
    return QString(name);
}